

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subset.hpp
# Opt level: O2

bool __thiscall
ut11::Operands::IsIterableContainingSubset<std::vector<int,std::allocator<int>>>::operator()
          (IsIterableContainingSubset<std::vector<int,std::allocator<int>>> *this,
          vector<int,_std::allocator<int>_> *actual)

{
  _List_node_base *p_Var1;
  bool bVar2;
  list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
  actualIterators;
  list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
  expectedIterators;
  _List_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_50;
  _List_node_base local_38;
  
  IsIterableContainingSubset<std::vector<int,_std::allocator<int>_>_>::
  CreateIteratorListFromInput<std::vector<int,_std::allocator<int>_>_>
            ((list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)&local_50,actual);
  IsIterableContainingSubset<std::vector<int,_std::allocator<int>_>_>::
  CreateIteratorListFromInput<std::vector<int,_std::allocator<int>_>_>
            ((list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)&local_38,*(vector<int,_std::allocator<int>_> **)this);
  do {
    p_Var1 = local_38._M_next;
    if (local_38._M_next == &local_38) break;
    bVar2 = CompareListsAndRemoveFirstDuplicate<std::__cxx11::list<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::allocator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>,std::__cxx11::list<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::allocator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>>
                      ((list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                        *)&local_38,
                       (list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                        *)&local_50);
  } while (bVar2);
  std::__cxx11::
  _List_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::_M_clear((_List_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)&local_38);
  std::__cxx11::
  _List_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::_M_clear(&local_50);
  return p_Var1 == &local_38;
}

Assistant:

bool operator()(const U& actual) const
			{
				auto actualIterators = CreateIteratorListFromInput(actual);
				auto expectedIterators = CreateIteratorListFromInput(m_expected);

				while( !expectedIterators.empty() )
				{
					if  (CompareListsAndRemoveFirstDuplicate(expectedIterators, actualIterators))
						continue;

					return false;
				}
				return true;
			}